

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecimalDatatypeValidator.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::DecimalDatatypeValidator::checkAdditionalFacetConstraintsBase
          (DecimalDatatypeValidator *this,MemoryManager *manager)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  DatatypeValidator *this_00;
  InvalidDatatypeFacetException *pIVar4;
  XMLCh local_5c8 [4];
  XMLCh value2_4 [65];
  XMLCh local_538 [4];
  XMLCh value1_4 [65];
  XMLCh local_4a8 [4];
  XMLCh value2_3 [65];
  XMLCh local_418 [4];
  XMLCh value1_3 [65];
  XMLCh local_388 [4];
  XMLCh value2_2 [65];
  XMLCh local_2f8 [4];
  XMLCh value1_2 [65];
  XMLCh local_268 [4];
  XMLCh value2_1 [65];
  XMLCh local_1d8 [4];
  XMLCh value1_1 [65];
  XMLCh local_148 [4];
  XMLCh value2 [65];
  XMLCh local_b8 [4];
  XMLCh value1 [65];
  int baseFacetsDefined;
  int thisFacetsDefined;
  DecimalDatatypeValidator *numBase;
  MemoryManager *manager_local;
  DecimalDatatypeValidator *this_local;
  
  this_00 = DatatypeValidator::getBaseValidator((DatatypeValidator *)this);
  if (this_00 != (DatatypeValidator *)0x0) {
    uVar1 = DatatypeValidator::getFacetsDefined((DatatypeValidator *)this);
    uVar2 = DatatypeValidator::getFacetsDefined(this_00);
    if ((uVar1 & 0x200) != 0) {
      if (((uVar2 & 0x200) != 0) && (*(uint *)&this_00[1].fPattern < this->fTotalDigits)) {
        XMLString::binToText(this->fTotalDigits,local_b8,0x40,10,manager);
        XMLString::binToText(*(uint *)&this_00[1].fPattern,local_148,0x40,10,manager);
        pIVar4 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
        InvalidDatatypeFacetException::InvalidDatatypeFacetException
                  (pIVar4,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/DecimalDatatypeValidator.cpp"
                   ,0xed,FACET_totalDigit_base_totalDigit,local_b8,local_148,(XMLCh *)0x0,
                   (XMLCh *)0x0,manager);
        __cxa_throw(pIVar4,&InvalidDatatypeFacetException::typeinfo,
                    InvalidDatatypeFacetException::~InvalidDatatypeFacetException);
      }
      if ((((uVar2 & 0x200) != 0) &&
          (uVar3 = DatatypeValidator::getFixed(this_00), (uVar3 & 0x200) != 0)) &&
         (this->fTotalDigits != *(uint *)&this_00[1].fPattern)) {
        XMLString::binToText(this->fTotalDigits,local_1d8,0x40,10,manager);
        XMLString::binToText(*(uint *)&this_00[1].fPattern,local_268,0x40,10,manager);
        pIVar4 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
        InvalidDatatypeFacetException::InvalidDatatypeFacetException
                  (pIVar4,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/DecimalDatatypeValidator.cpp"
                   ,0xfc,FACET_totalDigit_base_fixed,local_1d8,local_268,(XMLCh *)0x0,(XMLCh *)0x0,
                   manager);
        __cxa_throw(pIVar4,&InvalidDatatypeFacetException::typeinfo,
                    InvalidDatatypeFacetException::~InvalidDatatypeFacetException);
      }
    }
    if ((uVar1 & 0x400) != 0) {
      if (((uVar2 & 0x400) != 0) &&
         (*(uint *)((long)&this_00[1].fPattern + 4) < this->fFractionDigits)) {
        XMLString::binToText(this->fFractionDigits,local_2f8,0x40,10,manager);
        XMLString::binToText(*(uint *)((long)&this_00[1].fPattern + 4),local_388,0x40,10,manager);
        pIVar4 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
        InvalidDatatypeFacetException::InvalidDatatypeFacetException
                  (pIVar4,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/DecimalDatatypeValidator.cpp"
                   ,0x10e,FACET_fractDigit_base_fractDigit,local_2f8,local_388,(XMLCh *)0x0,
                   (XMLCh *)0x0,manager);
        __cxa_throw(pIVar4,&InvalidDatatypeFacetException::typeinfo,
                    InvalidDatatypeFacetException::~InvalidDatatypeFacetException);
      }
      if (((uVar2 & 0x200) != 0) && (*(uint *)&this_00[1].fPattern < this->fFractionDigits)) {
        XMLString::binToText(this->fFractionDigits,local_418,0x40,10,manager);
        XMLString::binToText(*(uint *)&this_00[1].fPattern,local_4a8,0x40,10,manager);
        pIVar4 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
        InvalidDatatypeFacetException::InvalidDatatypeFacetException
                  (pIVar4,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/DecimalDatatypeValidator.cpp"
                   ,0x11d,FACET_fractDigit_base_totalDigit,local_418,local_4a8,(XMLCh *)0x0,
                   (XMLCh *)0x0,manager);
        __cxa_throw(pIVar4,&InvalidDatatypeFacetException::typeinfo,
                    InvalidDatatypeFacetException::~InvalidDatatypeFacetException);
      }
      if ((((uVar2 & 0x400) != 0) &&
          (uVar1 = DatatypeValidator::getFixed(this_00), (uVar1 & 0x400) != 0)) &&
         (this->fFractionDigits != *(uint *)((long)&this_00[1].fPattern + 4))) {
        XMLString::binToText(this->fFractionDigits,local_538,0x40,10,manager);
        XMLString::binToText(*(uint *)((long)&this_00[1].fPattern + 4),local_5c8,0x40,10,manager);
        pIVar4 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
        InvalidDatatypeFacetException::InvalidDatatypeFacetException
                  (pIVar4,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/DecimalDatatypeValidator.cpp"
                   ,0x12d,FACET_fractDigit_base_fixed,local_538,local_5c8,(XMLCh *)0x0,(XMLCh *)0x0,
                   manager);
        __cxa_throw(pIVar4,&InvalidDatatypeFacetException::typeinfo,
                    InvalidDatatypeFacetException::~InvalidDatatypeFacetException);
      }
    }
  }
  return;
}

Assistant:

void DecimalDatatypeValidator::checkAdditionalFacetConstraintsBase(MemoryManager* const manager) const
{

    DecimalDatatypeValidator *numBase = (DecimalDatatypeValidator*) getBaseValidator();

    if (!numBase)
        return;

    int thisFacetsDefined = getFacetsDefined();
    int baseFacetsDefined = numBase->getFacetsDefined();

    // check 4.3.11.c1 error: totalDigits > base.totalDigits
    // totalDigits != base.totalDigits if (base.fixed)
    if (( thisFacetsDefined & DatatypeValidator::FACET_TOTALDIGITS) != 0)
    {
        if ( (( baseFacetsDefined & DatatypeValidator::FACET_TOTALDIGITS) != 0) &&
            ( fTotalDigits > numBase->fTotalDigits ))
        {
            XMLCh value1[BUF_LEN+1];
            XMLCh value2[BUF_LEN+1];
            XMLString::binToText(fTotalDigits, value1, BUF_LEN, 10, manager);
            XMLString::binToText(numBase->fTotalDigits, value2, BUF_LEN, 10, manager);
            ThrowXMLwithMemMgr2(InvalidDatatypeFacetException
                                 , XMLExcepts::FACET_totalDigit_base_totalDigit
                                 , value1
                                 , value2
                                 , manager);
        }

        if ( (( baseFacetsDefined & DatatypeValidator::FACET_TOTALDIGITS) != 0) &&
            (( numBase->getFixed() & DatatypeValidator::FACET_TOTALDIGITS) != 0) &&
            ( fTotalDigits != numBase->fTotalDigits ))
        {
            XMLCh value1[BUF_LEN+1];
            XMLCh value2[BUF_LEN+1];
            XMLString::binToText(fTotalDigits, value1, BUF_LEN, 10, manager);
            XMLString::binToText(numBase->fTotalDigits, value2, BUF_LEN, 10, manager);
            ThrowXMLwithMemMgr2(InvalidDatatypeFacetException
                                 , XMLExcepts::FACET_totalDigit_base_fixed
                                 , value1
                                 , value2
                                 , manager);
        }
    }

    if (( thisFacetsDefined & DatatypeValidator::FACET_FRACTIONDIGITS) != 0)
    {
        // check question error: fractionDigits > base.fractionDigits ???
        if ( (( baseFacetsDefined & DatatypeValidator::FACET_FRACTIONDIGITS) != 0) &&
            ( fFractionDigits > numBase->fFractionDigits ))
        {
            XMLCh value1[BUF_LEN+1];
            XMLCh value2[BUF_LEN+1];
            XMLString::binToText(fFractionDigits, value1, BUF_LEN, 10, manager);
            XMLString::binToText(numBase->fFractionDigits, value2, BUF_LEN, 10, manager);
            ThrowXMLwithMemMgr2(InvalidDatatypeFacetException
                                 , XMLExcepts::FACET_fractDigit_base_fractDigit
                                 , value1
                                 , value2
                                 , manager);
                        }

        // check question error: fractionDigits > base.totalDigits ???
        if ( (( baseFacetsDefined & DatatypeValidator::FACET_TOTALDIGITS) != 0) &&
            ( fFractionDigits > numBase->fTotalDigits ))
        {
            XMLCh value1[BUF_LEN+1];
            XMLCh value2[BUF_LEN+1];
            XMLString::binToText(fFractionDigits, value1, BUF_LEN, 10, manager);
            XMLString::binToText(numBase->fTotalDigits, value2, BUF_LEN, 10, manager);
            ThrowXMLwithMemMgr2(InvalidDatatypeFacetException
                                 , XMLExcepts::FACET_fractDigit_base_totalDigit
                                 , value1
                                 , value2
                                 , manager);
        }

        // fractionDigits != base.fractionDigits if (base.fixed)
        if ( (( baseFacetsDefined & DatatypeValidator::FACET_FRACTIONDIGITS) != 0) &&
            (( numBase->getFixed() & DatatypeValidator::FACET_FRACTIONDIGITS) != 0) &&
            ( fFractionDigits != numBase->fFractionDigits ))
        {
            XMLCh value1[BUF_LEN+1];
            XMLCh value2[BUF_LEN+1];
            XMLString::binToText(fFractionDigits, value1, BUF_LEN, 10, manager);
            XMLString::binToText(numBase->fFractionDigits, value2, BUF_LEN, 10, manager);
            ThrowXMLwithMemMgr2(InvalidDatatypeFacetException
                                 , XMLExcepts::FACET_fractDigit_base_fixed
                                 , value1
                                 , value2
                                 , manager);
        }
    }

}